

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb.c
# Opt level: O0

int hb_acc_pow_ctx_log_window_buffer(heartbeat_acc_pow_context *hb)

{
  int *piVar1;
  heartbeat_acc_pow_context *hb_local;
  
  if (hb == (heartbeat_acc_pow_context *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    piVar1 = __errno_location();
    hb_local._4_4_ = *piVar1;
  }
  else {
    hb_local._4_4_ = hb_acc_pow_log_window_buffer(hb,(hb->ws).log_fd);
  }
  return hb_local._4_4_;
}

Assistant:

int hb_ctx_log_window_buffer(const heartbeat_context* hb) {
#endif
  if (hb == NULL) {
    errno = EINVAL;
    return errno;
  }
#if defined(HEARTBEAT_MODE_ACC)
  return hb_acc_log_window_buffer(hb, hb->ws.log_fd);
#elif defined(HEARTBEAT_MODE_POW)
  return hb_pow_log_window_buffer(hb, hb->ws.log_fd);
#elif defined(HEARTBEAT_MODE_ACC_POW)
  return hb_acc_pow_log_window_buffer(hb, hb->ws.log_fd);
#else
  return hb_log_window_buffer(hb, hb->ws.log_fd);
#endif
}